

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

sftp_request * fxp_write_send(fxp_handle *handle,void *buffer,uint64_t offset,int len)

{
  BinarySink *bs;
  sftp_request *psVar1;
  sftp_packet *pkt;
  
  psVar1 = sftp_alloc_request();
  pkt = sftp_pkt_init(6);
  bs = pkt->binarysink_;
  BinarySink_put_uint32(bs,(ulong)psVar1->id);
  BinarySink_put_string(bs,handle->hstring,(long)handle->hlen);
  BinarySink_put_uint64(bs,offset);
  BinarySink_put_string(bs,buffer,(long)len);
  sftp_send(pkt);
  return psVar1;
}

Assistant:

struct sftp_request *fxp_write_send(struct fxp_handle *handle,
                                    void *buffer, uint64_t offset, int len)
{
    struct sftp_request *req = sftp_alloc_request();
    struct sftp_packet *pktout;

    pktout = sftp_pkt_init(SSH_FXP_WRITE);
    put_uint32(pktout, req->id);
    put_string(pktout, handle->hstring, handle->hlen);
    put_uint64(pktout, offset);
    put_string(pktout, buffer, len);
    sftp_send(pktout);

    return req;
}